

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O2

void __thiscall Animation_Constraint::Update(Animation_Constraint *this)

{
  Am_Object_Advanced *this_00;
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  byte bVar4;
  Am_Value_List targets;
  Am_Value_List starts;
  Am_Value t;
  Am_Value s;
  Am_Object local_90;
  Am_Object local_88;
  Am_Value_List local_80;
  Am_Value_List local_70;
  Animation_Constraint *local_60;
  Am_Object_Advanced *local_58;
  Am_Value local_50;
  Am_Value local_40;
  
  if (this->change_enqueued == true) {
    this->change_enqueued = false;
    this_00 = &this->interpolator;
    pAVar3 = Am_Object::Get(&this_00->super_Am_Object,0xf7,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    if (bVar1) {
      if (this->must_abort_animation != true) {
        Am_Interrupt_Animator(&this_00->super_Am_Object,&this->target);
        return;
      }
      this->must_abort_animation = false;
      Am_Object::Am_Object(&local_88,&this_00->super_Am_Object);
      Am_Abort_Animator(&local_88);
      Am_Object::~Am_Object(&local_88);
    }
    local_58 = this_00;
    if (this->multi_slot == false) {
      bVar1 = Am_Value::operator!=(&this->start,&this->target);
      bVar2 = Am_Value::Exists(&this->start);
      if (!bVar2) {
        return;
      }
      bVar2 = Am_Value::Exists(&this->target);
      if (!bVar1) {
        return;
      }
    }
    else {
      Am_Value_List::Am_Value_List(&local_70,&this->start);
      Am_Value_List::Am_Value_List(&local_80,&this->target);
      local_60 = this;
      Am_Value_List::Start(&local_70);
      Am_Value_List::Start(&local_80);
      bVar2 = true;
      bVar4 = 0;
      while ((bVar1 = Am_Value_List::Last(&local_70), !bVar1 &&
             (bVar1 = Am_Value_List::Last(&local_80), !bVar1))) {
        pAVar3 = Am_Value_List::Get(&local_70);
        Am_Value::Am_Value(&local_40,pAVar3);
        pAVar3 = Am_Value_List::Get(&local_80);
        Am_Value::Am_Value(&local_50,pAVar3);
        bVar1 = Am_Value::Exists(&local_40);
        if ((!bVar1) || (bVar1 = Am_Value::Exists(&local_50), !bVar1)) {
          bVar2 = false;
        }
        bVar1 = Am_Value::operator!=(&local_40,&local_50);
        Am_Value::~Am_Value(&local_50);
        Am_Value::~Am_Value(&local_40);
        Am_Value_List::Next(&local_70);
        bVar4 = bVar4 | bVar1;
        Am_Value_List::Next(&local_80);
      }
      Am_Value_List::~Am_Value_List(&local_80);
      Am_Value_List::~Am_Value_List(&local_70);
      this = local_60;
      if (bVar4 == 0) {
        return;
      }
    }
    if (bVar2 != false) {
      Am_Object::Am_Object(&local_90,&local_58->super_Am_Object);
      Am_Start_Animator(&local_90,&this->start,&this->target);
      Am_Object::~Am_Object(&local_90);
    }
  }
  return;
}

Assistant:

void
Animation_Constraint::Update()
{
  // std::cout << "Animation_Constraint::Update" <<std::endl;

  if (change_enqueued) {
    change_enqueued = false;

    bool running = interpolator.Get(Am_RUNNING);

    if (running) {
      if (must_abort_animation) {
        must_abort_animation = false;
        Am_Abort_Animator(interpolator);
      } else {
        Am_Interrupt_Animator(interpolator, target);
        return;
      }
    }

    // Decide whether to start the animation.
    // Do so only if at least one slot's target is different from its start,
    // and all slots have initialized starts and targets
    bool different;
    bool initialized;
    if (!multi_slot) {
      different = (start != target);
      initialized = start.Exists() && target.Exists();
    } else {
      Am_Value_List starts = start;
      Am_Value_List targets = target;

      different = false;
      initialized = true;

      for (starts.Start(), targets.Start(); !starts.Last() && !targets.Last();
           starts.Next(), targets.Next()) {
        Am_Value s = starts.Get();
        Am_Value t = targets.Get();

        if (!s.Exists() || !t.Exists())
          initialized = false;

        if (s != t)
          different = true;
      }
    }

    if (different && initialized)
      Am_Start_Animator(interpolator, start, target);
  }
}